

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace.h
# Opt level: O0

void kNameSpace_ImportSyntax2(KonohaContext *kctx,kNameSpace *ns,kSyntax *syn)

{
  undefined8 uVar1;
  kFunc *in_RDX;
  long in_RSI;
  kNameSpace *in_RDI;
  
  if (((ulong)in_RDX->env & 0x200000000) == 0x200000000) {
    if (*(long *)(in_RSI + 0x58) == *(long *)(*(long *)&in_RDI->packageId + 0x50)) {
      uVar1 = (*(code *)in_RDI->parentNULL[2].importedNameSpaceList)
                        (in_RDI,*(undefined8 *)(in_RSI + 0x28),
                         *(undefined8 *)(*(long *)(*(long *)&in_RDI->packageId + 8) + 0x30),0);
      *(undefined8 *)(in_RSI + 0x58) = uVar1;
    }
    (*(code *)in_RDI->parentNULL[2].genv)(in_RDI,*(undefined8 *)(in_RSI + 0x58),in_RDX);
  }
  if (0 < *(int *)&in_RDX[2].h.ct) {
    kNameSpace_SetTokenFuncMatrix((KonohaContext *)syn,in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX);
  }
  kNameSpace_ResetSyntaxList
            ((KonohaContext *)ns,(kNameSpace *)syn,(ksymbol_t)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

static void kNameSpace_ImportSyntax2(KonohaContext *kctx, kNameSpace *ns, kSyntax *syn)
{
	if(kSyntax_Is(MetaPattern, syn)) {
		if(ns->metaPatternList == K_EMPTYARRAY) {
			ns->metaPatternList = new_(Array, 0, ns->NameSpaceConstList);
		}
		KLIB kArray_Add(kctx, ns->metaPatternList, syn);
	}
	if(syn->tokenKonohaChar > 0) {
		kNameSpace_SetTokenFuncMatrix(kctx, ns, syn->tokenKonohaChar, syn->TokenFuncNULL);
	}
	kNameSpace_ResetSyntaxList(kctx, ns, syn->keyword);
}